

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O3

ON_RenderChannels * __thiscall
ON_RenderChannels::operator=(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  uint uVar1;
  ON_SimpleArray<ON_UUID_struct> chan;
  ON_SimpleArray<ON_UUID_struct> local_28;
  
  if (this != rch) {
    uVar1 = (*rch->_vptr_ON_RenderChannels[5])(rch);
    (*this->_vptr_ON_RenderChannels[6])(this,(ulong)uVar1);
    local_28._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080a318;
    local_28.m_a = (ON_UUID_struct *)0x0;
    local_28.m_count = 0;
    local_28.m_capacity = 0;
    (*rch->_vptr_ON_RenderChannels[7])(rch);
    (*this->_vptr_ON_RenderChannels[8])(this,&local_28);
    ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray(&local_28);
  }
  return this;
}

Assistant:

const ON_RenderChannels& ON_RenderChannels::operator = (const ON_RenderChannels& rch)
{
  if (this != &rch)
  {
    SetMode(rch.Mode());

    ON_SimpleArray<ON_UUID> chan;
    rch.GetCustomList(chan);
    SetCustomList(chan);
  }

  return *this;
}